

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

bool __thiscall jbcoin::STObject::clearFlag(STObject *this,uint32_t f)

{
  int iVar1;
  long lVar2;
  STBase *pSVar3;
  
  iVar1 = getFieldIndex(this,(SField *)sfFlags);
  if (iVar1 == -1) {
    pSVar3 = (STBase *)0x0;
  }
  else {
    pSVar3 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1].p_;
  }
  if (pSVar3 == (STBase *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pSVar3,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
  }
  if (lVar2 != 0) {
    *(uint *)(lVar2 + 0x10) = *(uint *)(lVar2 + 0x10) & ~f;
  }
  return lVar2 != 0;
}

Assistant:

bool STObject::clearFlag (std::uint32_t f)
{
    STUInt32* t = dynamic_cast<STUInt32*> (getPField (sfFlags));

    if (!t)
        return false;

    t->setValue (t->value () & ~f);
    return true;
}